

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  bool bVar1;
  char cVar2;
  value_type *this_00;
  char *pcVar3;
  char *pcVar4;
  TextRange *f;
  int i;
  char *text_end_local;
  char *text_local;
  ImGuiTextFilter *this_local;
  
  bVar1 = ImVector<ImGuiTextFilter::TextRange>::empty(&this->Filters);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    text_end_local = text;
    if (text == (char *)0x0) {
      text_end_local = "";
    }
    for (f._4_4_ = 0; f._4_4_ != (this->Filters).Size; f._4_4_ = f._4_4_ + 1) {
      this_00 = ImVector<ImGuiTextFilter::TextRange>::operator[](&this->Filters,f._4_4_);
      bVar1 = TextRange::empty(this_00);
      if (!bVar1) {
        cVar2 = TextRange::front(this_00);
        if (cVar2 == '-') {
          pcVar3 = TextRange::begin(this_00);
          pcVar4 = TextRange::end(this_00);
          pcVar3 = ImStristr(text_end_local,text_end,pcVar3 + 1,pcVar4);
          if (pcVar3 != (char *)0x0) {
            return false;
          }
        }
        else {
          pcVar3 = TextRange::begin(this_00);
          pcVar4 = TextRange::end(this_00);
          pcVar3 = ImStristr(text_end_local,text_end,pcVar3,pcVar4);
          if (pcVar3 != (char *)0x0) {
            return true;
          }
        }
      }
    }
    if (this->CountGrep == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const TextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.front() == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.begin()+1, f.end()) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.begin(), f.end()) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}